

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O3

ly_ht * lyht_new(uint32_t size,uint16_t val_size,lyht_value_equal_cb val_equal,void *cb_data,
                uint16_t resize)

{
  uint32_t uVar1;
  LY_ERR LVar2;
  ly_ht *ht;
  
  if ((size ^ size - 1) <= size - 1) {
    __assert_fail("size && !(size & (size - 1))",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/hash_table.c"
                  ,0x5c,
                  "struct ly_ht *lyht_new(uint32_t, uint16_t, lyht_value_equal_cb, void *, uint16_t)"
                 );
  }
  if ((val_size != 0) && (val_equal != (lyht_value_equal_cb)0x0)) {
    if (resize < 2) {
      ht = (ly_ht *)malloc(0x30);
      if (ht == (ly_ht *)0x0) {
        ht = (ly_ht *)0x0;
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyht_new");
      }
      else {
        uVar1 = 8;
        if (8 < size) {
          uVar1 = size;
        }
        ht->used = 0;
        ht->size = uVar1;
        ht->val_equal = val_equal;
        ht->cb_data = cb_data;
        ht->resize = resize;
        ht->rec_size = val_size + 8;
        LVar2 = lyht_init_hlists_and_records(ht);
        if (LVar2 != LY_SUCCESS) {
          free(ht);
          ht = (ly_ht *)0x0;
        }
      }
      return ht;
    }
    __assert_fail("resize == 0 || resize == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/hash_table.c"
                  ,0x5e,
                  "struct ly_ht *lyht_new(uint32_t, uint16_t, lyht_value_equal_cb, void *, uint16_t)"
                 );
  }
  __assert_fail("val_equal && val_size",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/hash_table.c"
                ,0x5d,
                "struct ly_ht *lyht_new(uint32_t, uint16_t, lyht_value_equal_cb, void *, uint16_t)")
  ;
}

Assistant:

ly_ht *
lyht_new(uint32_t size, uint16_t val_size, lyht_value_equal_cb val_equal, void *cb_data, uint16_t resize)
{
    struct ly_ht *ht;

    /* check that 2^x == size (power of 2) */
    assert(size && !(size & (size - 1)));
    assert(val_equal && val_size);
    assert(resize == 0 || resize == 1);

    if (size < LYHT_MIN_SIZE) {
        size = LYHT_MIN_SIZE;
    }

    ht = malloc(sizeof *ht);
    LY_CHECK_ERR_RET(!ht, LOGMEM(NULL), NULL);

    ht->used = 0;
    ht->size = size;
    ht->val_equal = val_equal;
    ht->cb_data = cb_data;
    ht->resize = resize;

    ht->rec_size = SIZEOF_LY_HT_REC + val_size;
    if (lyht_init_hlists_and_records(ht) != LY_SUCCESS) {
        free(ht);
        return NULL;
    }

    return ht;
}